

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiSSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  unsigned_long uVar1;
  char *pcVar2;
  char *writePointer;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  uVar1 = ndiHexToUnsignedLong(command + 6,4);
  mode = (unsigned_long)commandReply;
  if ((uVar1 & 1) != 0) {
    pol->SstatControl[0] = *commandReply;
    mode = (unsigned_long)(commandReply + 2);
    pol->SstatControl[1] = commandReply[1];
  }
  if ((uVar1 & 2) != 0) {
    pcVar2 = (char *)(mode + 1);
    pol->SstatSensor[0] = *(char *)mode;
    mode = mode + 2;
    pol->SstatSensor[1] = *pcVar2;
  }
  if ((uVar1 & 4) != 0) {
    pol->SstatTiu[0] = *(char *)mode;
    pol->SstatTiu[1] = *(char *)(mode + 1);
  }
  return;
}

Assistant:

void ndiSSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode;
    char* writePointer;

    // read the SSTAT command reply mode
    mode = ndiHexToUnsignedLong(&command[6], 4);

    if (mode & NDI_CONTROL)
    {
      writePointer = pol->SstatControl;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_SENSORS)
    {
      writePointer = pol->SstatSensor;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_TIU)
    {
      writePointer = pol->SstatTiu;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }
  }